

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall chrono::ChAssembly::Remove(ChAssembly *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  shared_ptr<chrono::ChPhysicsItem> local_70;
  shared_ptr<chrono::fea::ChMesh> local_60;
  shared_ptr<chrono::ChLinkBase> local_50;
  shared_ptr<chrono::ChShaft> local_40;
  shared_ptr<chrono::ChBody> local_30;
  
  peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    peVar2 = (element_type *)__dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChBody::typeinfo,0);
  }
  if (peVar2 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var6 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
  }
  if (peVar2 != (element_type *)0x0) {
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    local_30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6;
    RemoveBody(this,&local_30);
    if (local_30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (peVar2 == (element_type *)0x0) {
    peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      peVar3 = (element_type *)0x0;
    }
    else {
      peVar3 = (element_type *)__dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChShaft::typeinfo,0);
    }
    if (peVar3 == (element_type *)0x0) {
      peVar3 = (element_type *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var6 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
    }
    if (peVar3 != (element_type *)0x0) {
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_40.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      local_40.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var6;
      RemoveShaft(this,&local_40);
      if (local_40.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (peVar3 == (element_type *)0x0) {
      peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = (element_type *)
                 __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChLinkBase::typeinfo,0);
      }
      if (peVar4 == (element_type *)0x0) {
        peVar4 = (element_type *)0x0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var6 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      if (peVar4 != (element_type *)0x0) {
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_50.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        local_50.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var6;
        RemoveLink(this,&local_50);
        if (local_50.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (peVar4 == (element_type *)0x0) {
        peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1 == (element_type *)0x0) {
          peVar5 = (element_type *)0x0;
        }
        else {
          peVar5 = (element_type *)
                   __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&fea::ChMesh::typeinfo,0);
        }
        if (peVar5 == (element_type *)0x0) {
          peVar5 = (element_type *)0x0;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var6 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
        }
        if (peVar5 != (element_type *)0x0) {
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_60.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar5;
          local_60.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var6;
          RemoveMesh(this,&local_60);
          if (local_60.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        if (peVar5 == (element_type *)0x0) {
          local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          RemoveOtherPhysicsItem(this,&local_70);
          if (local_70.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.
                       super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ChAssembly::Remove(std::shared_ptr<ChPhysicsItem> item) {
    if (auto body = std::dynamic_pointer_cast<ChBody>(item)) {
        RemoveBody(body);
        return;
    }

    if (auto shaft = std::dynamic_pointer_cast<ChShaft>(item)) {
        RemoveShaft(shaft);
        return;
    }

    if (auto link = std::dynamic_pointer_cast<ChLinkBase>(item)) {
        RemoveLink(link);
        return;
    }

    if (auto mesh = std::dynamic_pointer_cast<fea::ChMesh>(item)) {
        RemoveMesh(mesh);
        return;
    }

    RemoveOtherPhysicsItem(item);
}